

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O1

time_t xstrpisotime(char *s,char **endptr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ushort **ppuVar4;
  time_t tVar5;
  tm tm;
  char *local_50;
  tm local_48;
  
  local_48.tm_isdst = 0;
  local_48._36_4_ = 0;
  local_48.tm_gmtoff = 0;
  local_48.tm_mon = 0;
  local_48.tm_year = 0;
  local_48.tm_wday = 0;
  local_48.tm_yday = 0;
  local_48.tm_sec = 0;
  local_48.tm_min = 0;
  local_48.tm_hour = 0;
  local_48.tm_mday = 0;
  local_48.tm_zone = (char *)0x0;
  local_50 = s;
  ppuVar4 = __ctype_b_loc();
  local_50 = s + -1;
  do {
    pcVar1 = local_50 + 1;
    local_50 = local_50 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
  iVar3 = strtoi_lim(local_50,&local_50,0x62f,0xfff);
  tVar5 = -1;
  if (-1 < iVar3) {
    pcVar1 = local_50 + 1;
    cVar2 = *local_50;
    local_50 = pcVar1;
    if (cVar2 == '-') {
      local_48.tm_year = iVar3;
      local_48.tm_mon = strtoi_lim(pcVar1,&local_50,1,0xc);
      if (-1 < local_48.tm_mon) {
        pcVar1 = local_50 + 1;
        cVar2 = *local_50;
        local_50 = pcVar1;
        if (cVar2 == '-') {
          iVar3 = strtoi_lim(pcVar1,&local_50,1,0x1f);
          if (-1 < iVar3) {
            pcVar1 = local_50 + 1;
            cVar2 = *local_50;
            local_50 = pcVar1;
            if (cVar2 == 'T') {
              local_48.tm_mday = iVar3;
              local_48.tm_hour = strtoi_lim(pcVar1,&local_50,0,0x17);
              if (-1 < local_48.tm_hour) {
                pcVar1 = local_50 + 1;
                cVar2 = *local_50;
                local_50 = pcVar1;
                if (cVar2 == ':') {
                  iVar3 = strtoi_lim(pcVar1,&local_50,0,0x3b);
                  if (-1 < iVar3) {
                    pcVar1 = local_50 + 1;
                    cVar2 = *local_50;
                    local_50 = pcVar1;
                    if (cVar2 == ':') {
                      local_48.tm_min = iVar3;
                      local_48.tm_sec = strtoi_lim(pcVar1,&local_50,0,0x3c);
                      if ((-1 < local_48.tm_sec) &&
                         (pcVar1 = local_50 + 1, cVar2 = *local_50, local_50 = pcVar1, cVar2 == 'Z')
                         ) {
                        local_48.tm_year = local_48.tm_year + -0x76c;
                        local_48.tm_mon = local_48.tm_mon + -1;
                        tVar5 = timegm(&local_48);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = local_50;
  }
  return tVar5;
}

Assistant:

static time_t
xstrpisotime(const char *s, char **endptr)
{
/** like strptime() but strictly for ISO 8601 Zulu strings */
	struct tm tm;
	time_t res = (time_t)-1;

	/* make sure tm is clean */
	memset(&tm, 0, sizeof(tm));

	/* as a courtesy to our callers, and since this is a non-standard
	 * routine, we skip leading whitespace */
	for (; isspace(*s); s++);

	/* read year */
	if ((tm.tm_year = strtoi_lim(s, &s, 1583, 4095)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read month */
	if ((tm.tm_mon = strtoi_lim(s, &s, 1, 12)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read day-of-month */
	if ((tm.tm_mday = strtoi_lim(s, &s, 1, 31)) < 0 || *s++ != 'T') {
		goto out;
	}
	/* read hour */
	if ((tm.tm_hour = strtoi_lim(s, &s, 0, 23)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read minute */
	if ((tm.tm_min = strtoi_lim(s, &s, 0, 59)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read second */
	if ((tm.tm_sec = strtoi_lim(s, &s, 0, 60)) < 0 || *s++ != 'Z') {
		goto out;
	}

	/* massage TM to fulfill some of POSIX' contraints */
	tm.tm_year -= 1900;
	tm.tm_mon--;

	/* now convert our custom tm struct to a unix stamp using UTC */
	res = time_from_tm(&tm);

out:
	if (endptr != NULL) {
		*endptr = deconst(s);
	}
	return res;
}